

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_protect.cpp
# Opt level: O0

void __thiscall
EmptyStore_ProtectAllOfOneRegion_Test::~EmptyStore_ProtectAllOfOneRegion_Test
          (EmptyStore_ProtectAllOfOneRegion_Test *this)

{
  EmptyStore_ProtectAllOfOneRegion_Test *this_local;
  
  ~EmptyStore_ProtectAllOfOneRegion_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F (EmptyStore, ProtectAllOfOneRegion) {
    using ::testing::_;
    using ::testing::Ref;
    using ::testing::Return;

    auto const fixed_page_size_bytes = 4096U;
    auto page_size = std::make_unique<fixed_page_size> ();
    EXPECT_CALL (*page_size, get ()).WillRepeatedly (Return (fixed_page_size_bytes));

    // Create the data store instance. It will use 4K pages mapped using mock_mapper instances.
    pstore::database db{store_.file (), std::move (page_size),
                        std::make_unique<mock_region_factory> (store_.file (),
                                                               pstore::storage::min_region_size,
                                                               pstore::storage::min_region_size)};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);


    pstore::storage::region_container const & regions = db.storage ().regions ();
    EXPECT_EQ (1U, regions.size ()) << "Expected the store to use 1 region";

    // I expect db.protect() to call mock_mapper::read_only() once with
    // - The first parameter should equal one page into the memory block (the first page of the
    //  data store must remain writable.
    // - The second should be the size of the file minus the size of that missing first page.
    auto r0 = cast<mock_mapper> (regions.at (0));

    // If "POSIX small file" mode is enabled, the file will be smaller than a VM page (4K), so
    // read_only() won't be called at all.
    if (pstore::database::small_files_enabled ()) {
        EXPECT_CALL (*r0.get (), read_only (_, _)).Times (0);
    } else {
        void * addr = reinterpret_cast<std::uint8_t *> (store_.file ()->data ().get ()) +
                      fixed_page_size_bytes;
        EXPECT_CALL (*r0.get (), read_only (addr, store_.file ()->size () - fixed_page_size_bytes))
            .Times (1);
    }

    db.protect (pstore::address::null (), pstore::address{store_.file ()->size ()});
}